

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * make_GLSL_swizzle_string(char *swiz_str,size_t strsize,int swizzle,int writemask)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = (uint)strsize;
  if (swizzle == 0xf && uVar2 == 0xe4) {
    lVar1 = 0;
  }
  else {
    *swiz_str = '.';
    lVar1 = 1;
    if ((swizzle & 1U) != 0) {
      swiz_str[1] = "xyzw"[uVar2 & 3];
      lVar1 = 2;
    }
    if ((swizzle & 2U) != 0) {
      swiz_str[lVar1] = "xyzw"[(uint)(strsize >> 2) & 3];
      lVar1 = lVar1 + 1;
    }
    if ((swizzle & 4U) != 0) {
      swiz_str[lVar1] = "xyzw"[(uint)(strsize >> 4) & 3];
      lVar1 = lVar1 + 1;
    }
    if ((swizzle & 8U) != 0) {
      swiz_str[lVar1] = "xyzw"[uVar2 >> 6 & 3];
      lVar1 = lVar1 + 1;
    }
  }
  swiz_str[lVar1] = '\0';
  return swiz_str;
}

Assistant:

static char *make_GLSL_swizzle_string(char *swiz_str, const size_t strsize,
                                      const int swizzle, const int writemask)
{
    size_t i = 0;
    if ( (!no_swizzle(swizzle)) || (!writemask_xyzw(writemask)) )
    {
        const int writemask0 = (writemask >> 0) & 0x1;
        const int writemask1 = (writemask >> 1) & 0x1;
        const int writemask2 = (writemask >> 2) & 0x1;
        const int writemask3 = (writemask >> 3) & 0x1;

        const int swizzle_x = (swizzle >> 0) & 0x3;
        const int swizzle_y = (swizzle >> 2) & 0x3;
        const int swizzle_z = (swizzle >> 4) & 0x3;
        const int swizzle_w = (swizzle >> 6) & 0x3;

        swiz_str[i++] = '.';
        if (writemask0) swiz_str[i++] = swizzle_channels[swizzle_x];
        if (writemask1) swiz_str[i++] = swizzle_channels[swizzle_y];
        if (writemask2) swiz_str[i++] = swizzle_channels[swizzle_z];
        if (writemask3) swiz_str[i++] = swizzle_channels[swizzle_w];
    } // if
    assert(i < strsize);
    swiz_str[i] = '\0';
    return swiz_str;
}